

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureMipmapTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::texture::anon_unknown_0::Texture3DLodControlTestInstance::iterate
          (TestStatus *__return_storage_ptr__,Texture3DLodControlTestInstance *this)

{
  TextureRenderer *this_00;
  ostringstream *this_01;
  TextureFormat TVar1;
  TextureFormat TVar2;
  TestLog *pTVar3;
  TestStatus *pTVar4;
  int iVar5;
  deUint32 width;
  deUint32 height;
  uint uVar6;
  int iVar7;
  undefined4 extraout_var;
  TextureBinding *this_02;
  undefined4 extraout_var_00;
  uint uVar8;
  Surface *pSVar9;
  byte bVar10;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  int iVar11;
  void *pvVar12;
  deUint32 dVar13;
  int iVar14;
  deUint32 dVar15;
  deUint32 dVar16;
  int iVar17;
  int iVar18;
  int x;
  undefined1 auVar19 [16];
  int local_520;
  int local_518;
  undefined1 local_4e8 [40];
  undefined1 local_4c0 [44];
  int local_494;
  undefined1 local_490 [40];
  vector<float,_std::allocator<float>_> texCoord;
  Surface referenceFrame;
  Surface renderedFrame;
  undefined1 local_418 [40];
  Surface errorMask;
  LodPrecision lodPrec;
  Texture3DView local_3c8;
  PixelFormat local_3b8;
  TestStatus *local_3a8;
  TextureFormat *local_3a0;
  undefined1 local_398 [24];
  undefined8 local_380;
  size_type sStack_378;
  BVec4 local_370;
  Vector<int,_4> res;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_358;
  _Alloc_hider local_348;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_338 [6];
  IVec4 formatBitDepth;
  undefined1 local_2c4 [76];
  size_type sStack_278;
  size_type local_270;
  int aiStack_268 [2];
  int local_260;
  deUint32 local_238;
  deUint32 local_234;
  undefined1 local_230 [32];
  int local_210;
  undefined1 auStack_20c [84];
  ios_base local_1b8 [268];
  TextureFormatInfo fmtInfo;
  Sampler sampler;
  TextureFormat *format;
  
  local_3a8 = __return_storage_ptr__;
  iVar5 = (*(((this->m_texture).m_ptr)->super_TestTexture)._vptr_TestTexture[0x11])();
  format = (TextureFormat *)CONCAT44(extraout_var,iVar5);
  tcu::getTextureFormatInfo(&fmtInfo,format);
  this_00 = &this->m_renderer;
  width = util::TextureRenderer::getRenderWidth(this_00);
  height = util::TextureRenderer::getRenderHeight(this_00);
  util::createSampler(&sampler,CLAMP_TO_EDGE,CLAMP_TO_EDGE,this->m_minFilter,NEAREST);
  glu::TextureTestUtil::ReferenceParams::ReferenceParams
            ((ReferenceParams *)local_2c4,TEXTURETYPE_3D,&sampler,LODMODE_EXACT);
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  tcu::Surface::Surface(&renderedFrame,width,height);
  dVar16 = width + 3;
  if (-1 < (int)width) {
    dVar16 = width;
  }
  dVar13 = height + 3;
  if (-1 < (int)height) {
    dVar13 = height;
  }
  util::createSampler((Sampler *)local_230,CLAMP_TO_EDGE,CLAMP_TO_EDGE,CLAMP_TO_EDGE,
                      (this->m_testParameters).super_Texture3DTestCaseParameters.
                      super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.
                      minFilter,NEAREST);
  local_260 = local_210;
  local_270 = local_230._16_8_;
  aiStack_268[0] = local_230._24_4_;
  aiStack_268[1] = local_230._28_4_;
  local_2c4._68_8_ = local_230._0_8_;
  sStack_278 = local_230._8_8_;
  local_2c4._4_4_ = glu::TextureTestUtil::getSamplerType(*format);
  local_2c4._52_4_ = fmtInfo.lookupBias.m_data[0];
  local_2c4._56_4_ = fmtInfo.lookupBias.m_data[1];
  local_2c4._60_4_ = fmtInfo.lookupBias.m_data[2];
  local_2c4._64_4_ = fmtInfo.lookupBias.m_data[3];
  local_2c4._36_4_ = fmtInfo.lookupScale.m_data[0];
  local_2c4._40_4_ = fmtInfo.lookupScale.m_data[1];
  local_2c4._44_4_ = fmtInfo.lookupScale.m_data[2];
  local_2c4._48_4_ = fmtInfo.lookupScale.m_data[3];
  uVar8 = this->m_texHeight;
  if (this->m_texHeight < this->m_texWidth) {
    uVar8 = this->m_texWidth;
  }
  if ((int)uVar8 <= this->m_texDepth) {
    uVar8 = this->m_texDepth;
  }
  if (uVar8 == 0) {
    uVar6 = 0x20;
  }
  else {
    uVar6 = 0x1f;
    if (uVar8 != 0) {
      for (; uVar8 >> uVar6 == 0; uVar6 = uVar6 - 1) {
      }
    }
    uVar6 = uVar6 ^ 0x1f;
  }
  dVar16 = (int)dVar16 >> 2;
  iVar5 = (int)dVar13 >> 2;
  local_234 = 0x1f - uVar6;
  local_518 = 0;
  iVar11 = 0;
  local_3a0 = format;
  do {
    iVar7 = height - iVar11 * iVar5;
    if (iVar11 != 3) {
      iVar7 = iVar5;
    }
    iVar18 = 0;
    dVar13 = width;
    for (iVar17 = 0; iVar17 != 4; iVar17 = iVar17 + 1) {
      dVar15 = dVar16;
      if (iVar17 == 3) {
        dVar15 = dVar13;
      }
      getBasicTexCoord3D(&texCoord,local_518 + iVar17);
      (*(this->super_TestInstance)._vptr_TestInstance[3])
                (this,local_2c4,(ulong)(uint)(local_518 + iVar17));
      util::TextureRenderer::setViewport
                (this_00,(float)iVar18,(float)(iVar11 * iVar5),(float)(int)dVar15,(float)iVar7);
      this_02 = util::TextureRenderer::getTextureBinding(this_00,0);
      util::TextureBinding::updateTextureViewMipLevels(this_02,local_238,local_234);
      dVar13 = dVar13 - dVar16;
      iVar18 = iVar18 + dVar16;
      util::TextureRenderer::renderQuad
                (this_00,&renderedFrame,0,
                 texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start,(ReferenceParams *)local_2c4);
    }
    iVar11 = iVar11 + 1;
    local_518 = local_518 + 4;
  } while (iVar11 != 4);
  local_230._0_8_ = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  tcu::getTextureFormatBitDepth((tcu *)&formatBitDepth,(TextureFormat *)local_230);
  local_3b8.redBits = formatBitDepth.m_data[0];
  local_3b8.greenBits = formatBitDepth.m_data[1];
  local_3b8.blueBits = formatBitDepth.m_data[2];
  local_3b8.alphaBits = formatBitDepth.m_data[3];
  iVar11 = -1 - (uint)((this->m_minFilter - NEAREST_MIPMAP_LINEAR & 0xfffffffd) == 0);
  tcu::Surface::Surface(&referenceFrame,width,height);
  tcu::Surface::Surface(&errorMask,width,height);
  local_398._16_4_ = 0x10;
  local_398._20_4_ = 0x10;
  local_380._0_4_ = 0.0;
  local_380._4_4_ = 0.0;
  sStack_378._0_4_ = 0.0;
  sStack_378._4_4_ = 0.0;
  local_370.m_data[0] = true;
  local_370.m_data[1] = true;
  local_370.m_data[2] = true;
  local_370.m_data[3] = true;
  lodPrec.rule = RULE_VULKAN;
  lodPrec.derivateBits = 0x16;
  lodPrec.lodBits = 0x10;
  local_398._0_4_ = 0x14;
  local_398._4_4_ = 0x14;
  local_398._8_4_ = 0x14;
  local_398._12_4_ = 0x10;
  res.m_data[0] = -(uint)(0 < iVar11 + local_3b8.redBits) & iVar11 + local_3b8.redBits;
  res.m_data[1] = -(uint)(0 < iVar11 + local_3b8.greenBits) & iVar11 + local_3b8.greenBits;
  res.m_data[3] = -(uint)(0 < iVar11 + local_3b8.alphaBits) & iVar11 + local_3b8.alphaBits;
  res.m_data[2] = -(uint)(0 < iVar11 + local_3b8.blueBits) & iVar11 + local_3b8.blueBits;
  tcu::computeFixedPointThreshold((tcu *)local_230,&res);
  local_380._0_4_ = (float)local_230._0_4_;
  local_380._4_4_ = (float)local_230._4_4_;
  sStack_378 = local_230._8_8_;
  auVar19._0_4_ = -(uint)(0 < local_3b8.redBits);
  auVar19._4_4_ = -(uint)(0 < local_3b8.greenBits);
  auVar19._8_4_ = -(uint)(0 < local_3b8.blueBits);
  auVar19._12_4_ = -(uint)(0 < local_3b8.alphaBits);
  uVar8 = movmskps((int)&local_3b8,auVar19);
  bVar10 = (byte)uVar8;
  local_370.m_data =
       (bool  [4])
       (uVar8 & 1 | (uint)((bVar10 & 2) >> 1) << 8 | (uint)((bVar10 & 4) >> 2) << 0x10 |
       (uint)(bVar10 >> 3) << 0x18);
  lodPrec.derivateBits = 10;
  lodPrec.lodBits = 8;
  iVar11 = 0;
  iVar7 = 0;
  local_520 = 0;
  do {
    iVar18 = iVar7 * iVar5;
    iVar17 = height - iVar18;
    if (iVar7 != 3) {
      iVar17 = iVar5;
    }
    x = 0;
    iVar14 = 0;
    local_494 = iVar7;
    dVar13 = width;
    do {
      dVar15 = dVar16;
      if (iVar14 == 3) {
        dVar15 = dVar13;
      }
      getBasicTexCoord3D(&texCoord,iVar11 + iVar14);
      (*(this->super_TestInstance)._vptr_TestInstance[3])
                (this,local_2c4,(ulong)(uint)(iVar11 + iVar14));
      tcu::SurfaceAccess::SurfaceAccess
                ((SurfaceAccess *)local_230,&referenceFrame,&local_3b8,x,iVar18,dVar15,iVar17);
      res.m_data[0] = local_3a0[9].order;
      res.m_data._8_8_ = local_3a0[10];
      glu::TextureTestUtil::sampleTexture
                ((SurfaceAccess *)local_230,(Texture3DView *)&res,
                 texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start,(ReferenceParams *)local_2c4);
      local_4e8._0_4_ = RGBA;
      local_4e8._4_4_ = UNORM_INT8;
      pvVar12 = (void *)renderedFrame.m_pixels.m_cap;
      if (renderedFrame.m_pixels.m_cap != 0) {
        pvVar12 = renderedFrame.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)&res,(TextureFormat *)local_4e8,renderedFrame.m_width,
                 renderedFrame.m_height,1,pvVar12);
      tcu::getSubregion((PixelBufferAccess *)local_230,(PixelBufferAccess *)&res,x,iVar18,dVar15,
                        iVar17);
      local_4c0._0_4_ = RGBA;
      local_4c0._4_4_ = UNORM_INT8;
      pvVar12 = (void *)referenceFrame.m_pixels.m_cap;
      if (referenceFrame.m_pixels.m_cap != 0) {
        pvVar12 = referenceFrame.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)local_490,(TextureFormat *)local_4c0,referenceFrame.m_width,
                 referenceFrame.m_height,1,pvVar12);
      tcu::getSubregion((PixelBufferAccess *)local_4e8,(PixelBufferAccess *)local_490,x,iVar18,
                        dVar15,iVar17);
      local_3c8.m_numLevels = 8;
      local_3c8._4_4_ = 3;
      pvVar12 = (void *)errorMask.m_pixels.m_cap;
      if (errorMask.m_pixels.m_cap != 0) {
        pvVar12 = errorMask.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)local_418,(TextureFormat *)&local_3c8,errorMask.m_width,
                 errorMask.m_height,1,pvVar12);
      tcu::getSubregion((PixelBufferAccess *)local_4c0,(PixelBufferAccess *)local_418,x,iVar18,
                        dVar15,iVar17);
      iVar7 = (*(((this->m_texture).m_ptr)->super_TestTexture)._vptr_TestTexture[0x11])();
      local_3c8.m_levels = *(ConstPixelBufferAccess **)(CONCAT44(extraout_var_00,iVar7) + 0x50);
      local_3c8.m_numLevels = *(int *)(CONCAT44(extraout_var_00,iVar7) + 0x48);
      iVar7 = glu::TextureTestUtil::computeTextureLookupDiff
                        ((ConstPixelBufferAccess *)local_230,(ConstPixelBufferAccess *)local_4e8,
                         (PixelBufferAccess *)local_4c0,&local_3c8,
                         texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start,(ReferenceParams *)local_2c4,
                         (LookupPrecision *)local_398,&lodPrec,
                         ((this->super_TestInstance).m_context)->m_testCtx->m_watchDog);
      iVar14 = iVar14 + 1;
      local_520 = local_520 + iVar7;
      dVar13 = dVar13 - dVar16;
      x = x + dVar16;
    } while (iVar14 != 4);
    iVar7 = local_494 + 1;
    iVar11 = iVar11 + 4;
  } while (iVar7 != 4);
  if (0 < local_520) {
    local_230._0_8_ = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
    this_01 = (ostringstream *)(local_230 + 8);
    std::__cxx11::ostringstream::ostringstream(this_01);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_01,"ERROR: Image verification failed, found ",0x28);
    std::ostream::operator<<(this_01,local_520);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01," invalid pixels!",0x10);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_230,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_01);
    std::ios_base::~ios_base(local_1b8);
  }
  pTVar3 = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
  local_4e8._0_8_ = (long)local_4e8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4e8,"Result","");
  local_490._0_8_ = (long)local_490 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_490,"Verification result","");
  tcu::LogImageSet::LogImageSet((LogImageSet *)&res,(string *)local_4e8,(string *)local_490);
  tcu::TestLog::startImageSet(pTVar3,(char *)CONCAT44(res.m_data[1],res.m_data[0]),local_348._M_p);
  local_4c0._0_8_ = (long)local_4c0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4c0,"Rendered","");
  TVar1 = (TextureFormat)((long)local_418 + 0x10);
  local_418._0_8_ = TVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"Rendered image","");
  pSVar9 = &renderedFrame;
  tcu::LogImage::LogImage
            ((LogImage *)local_230,(string *)local_4c0,(string *)local_418,pSVar9,
             QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::LogImage::write((LogImage *)local_230,(int)pTVar3,__buf,(size_t)pSVar9);
  if ((undefined1 *)CONCAT44(auStack_20c._0_4_,local_210) != auStack_20c + 0xc) {
    operator_delete((undefined1 *)CONCAT44(auStack_20c._0_4_,local_210),
                    CONCAT44(auStack_20c._16_4_,auStack_20c._12_4_) + 1);
  }
  TVar2 = (TextureFormat)((long)local_230 + 0x10);
  if ((TextureFormat)local_230._0_8_ != TVar2) {
    operator_delete((void *)local_230._0_8_,local_230._16_8_ + 1);
  }
  if ((TextureFormat)local_418._0_8_ != TVar1) {
    operator_delete((void *)local_418._0_8_,local_418._16_8_ + 1);
  }
  if (local_4c0._0_8_ != (long)local_4c0 + 0x10) {
    operator_delete((void *)local_4c0._0_8_,local_4c0._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_p != local_338) {
    operator_delete(local_348._M_p,local_338[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(res.m_data[1],res.m_data[0]) != &local_358) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(res.m_data[1],res.m_data[0]),local_358._M_allocated_capacity + 1);
  }
  if (local_490._0_8_ != (long)local_490 + 0x10) {
    operator_delete((void *)local_490._0_8_,local_490._16_8_ + 1);
  }
  if (local_4e8._0_8_ != (long)local_4e8 + 0x10) {
    operator_delete((void *)local_4e8._0_8_,local_4e8._16_8_ + 1);
  }
  if (0 < local_520) {
    pTVar3 = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
    local_4e8._0_8_ = (long)local_4e8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_4e8,"Reference","");
    local_490._0_8_ = (long)local_490 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_490,"Ideal reference","");
    pSVar9 = &referenceFrame;
    tcu::LogImage::LogImage
              ((LogImage *)local_230,(string *)local_4e8,(string *)local_490,pSVar9,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    iVar5 = (int)pTVar3;
    tcu::LogImage::write((LogImage *)local_230,iVar5,__buf_00,(size_t)pSVar9);
    local_4c0._0_8_ = (long)local_4c0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_4c0,"ErrorMask","");
    local_418._0_8_ = TVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"Error mask","");
    pSVar9 = &errorMask;
    tcu::LogImage::LogImage
              ((LogImage *)&res,(string *)local_4c0,(string *)local_418,pSVar9,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)&res,iVar5,__buf_01,(size_t)pSVar9);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._M_p != local_338) {
      operator_delete(local_348._M_p,local_338[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(res.m_data[1],res.m_data[0]) != &local_358) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(res.m_data[1],res.m_data[0]),local_358._M_allocated_capacity + 1);
    }
    if ((TextureFormat)local_418._0_8_ != TVar1) {
      operator_delete((void *)local_418._0_8_,local_418._16_8_ + 1);
    }
    if (local_4c0._0_8_ != (long)local_4c0 + 0x10) {
      operator_delete((void *)local_4c0._0_8_,local_4c0._16_8_ + 1);
    }
    if ((undefined1 *)CONCAT44(auStack_20c._0_4_,local_210) != auStack_20c + 0xc) {
      operator_delete((undefined1 *)CONCAT44(auStack_20c._0_4_,local_210),
                      CONCAT44(auStack_20c._16_4_,auStack_20c._12_4_) + 1);
    }
    if ((TextureFormat)local_230._0_8_ != TVar2) {
      operator_delete((void *)local_230._0_8_,local_230._16_8_ + 1);
    }
    if (local_490._0_8_ != (long)local_490 + 0x10) {
      operator_delete((void *)local_490._0_8_,local_490._16_8_ + 1);
    }
    if (local_4e8._0_8_ != (long)local_4e8 + 0x10) {
      operator_delete((void *)local_4e8._0_8_,local_4e8._16_8_ + 1);
    }
  }
  tcu::TestLog::endImageSet(((this->super_TestInstance).m_context)->m_testCtx->m_log);
  pTVar4 = local_3a8;
  local_230._0_8_ = TVar2;
  if (local_520 == 0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"pass","");
    pTVar4->m_code = QP_TEST_RESULT_PASS;
    (pTVar4->m_description)._M_dataplus._M_p = (pointer)&(pTVar4->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar4->m_description,local_230._0_8_,local_230._8_8_ + local_230._0_8_);
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"fail","");
    pTVar4->m_code = QP_TEST_RESULT_FAIL;
    (pTVar4->m_description)._M_dataplus._M_p = (pointer)&(pTVar4->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar4->m_description,local_230._0_8_,local_230._8_8_ + local_230._0_8_);
  }
  if ((TextureFormat)local_230._0_8_ != TVar2) {
    operator_delete((void *)local_230._0_8_,local_230._16_8_ + 1);
  }
  tcu::Surface::~Surface(&errorMask);
  tcu::Surface::~Surface(&referenceFrame);
  tcu::Surface::~Surface(&renderedFrame);
  if (texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return pTVar4;
}

Assistant:

tcu::TestStatus Texture3DLodControlTestInstance::iterate (void)
{
	const tcu::Sampler::WrapMode	wrapS			= Sampler::CLAMP_TO_EDGE;
	const tcu::Sampler::WrapMode	wrapT			= Sampler::CLAMP_TO_EDGE;
	const tcu::Sampler::WrapMode	wrapR			= Sampler::CLAMP_TO_EDGE;
	const tcu::Sampler::FilterMode	magFilter		= Sampler::NEAREST;

	const tcu::Texture3D&			refTexture		= m_texture->getTexture();
	const tcu::TextureFormat&		texFmt			= refTexture.getFormat();
	const tcu::TextureFormatInfo	fmtInfo			= tcu::getTextureFormatInfo(texFmt);
	const int						viewportWidth	= m_renderer.getRenderWidth();
	const int						viewportHeight	= m_renderer.getRenderHeight();

	tcu::Sampler					sampler			= util::createSampler(wrapS, wrapT, m_minFilter, magFilter);
	ReferenceParams					refParams		(TEXTURETYPE_3D, sampler);
	vector<float>					texCoord;
	tcu::Surface					renderedFrame	(viewportWidth, viewportHeight);

	// Viewport is divided into 4x4 grid.
	const int						gridWidth		= 4;
	const int						gridHeight		= 4;
	const int						cellWidth		= viewportWidth / gridWidth;
	const int						cellHeight		= viewportHeight / gridHeight;

	// Sampling parameters.
	refParams.sampler		= util::createSampler(wrapS, wrapT, wrapR, m_testParameters.minFilter, magFilter);
	refParams.samplerType	= getSamplerType(texFmt);
	refParams.colorBias		= fmtInfo.lookupBias;
	refParams.colorScale	= fmtInfo.lookupScale;
	refParams.maxLevel		= deLog2Floor32(de::max(de::max(m_texWidth, m_texHeight), m_texDepth));

	// Render cells.
	for (int gridY = 0; gridY < gridHeight; gridY++)
	{
		for (int gridX = 0; gridX < gridWidth; gridX++)
		{
			const int	curX		= cellWidth*gridX;
			const int	curY		= cellHeight*gridY;
			const int	curW		= gridX+1 == gridWidth ? (viewportWidth-curX) : cellWidth;
			const int	curH		= gridY+1 == gridHeight ? (viewportHeight-curY) : cellHeight;
			const int	cellNdx		= gridY*gridWidth + gridX;

			// Compute texcoord.
			getBasicTexCoord3D(texCoord, cellNdx);

			getReferenceParams(refParams,cellNdx);
			//Render
			m_renderer.setViewport((float)curX, (float)curY, (float)curW, (float)curH);
			m_renderer.getTextureBinding(0)->updateTextureViewMipLevels(refParams.baseLevel, refParams.maxLevel);
			m_renderer.renderQuad(renderedFrame, 0, &texCoord[0], refParams);
		}
	}

	// Compare and log
	{
		const tcu::IVec4		formatBitDepth	= getTextureFormatBitDepth(mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM));
		const tcu::PixelFormat	pixelFormat		(formatBitDepth[0], formatBitDepth[1], formatBitDepth[2], formatBitDepth[3]);
		const bool				isTrilinear		= m_minFilter == Sampler::NEAREST_MIPMAP_LINEAR || m_minFilter == Sampler::LINEAR_MIPMAP_LINEAR;
		tcu::Surface			referenceFrame	(viewportWidth, viewportHeight);
		tcu::Surface			errorMask		(viewportWidth, viewportHeight);
		tcu::LookupPrecision	lookupPrec;
		tcu::LodPrecision		lodPrec			(tcu::LodPrecision::RULE_VULKAN);
		int						numFailedPixels	= 0;

		lookupPrec.coordBits		= tcu::IVec3(20, 20, 20);
		lookupPrec.uvwBits			= tcu::IVec3(16, 16, 16); // Doesn't really matter since pixels are unicolored.
		lookupPrec.colorThreshold	= tcu::computeFixedPointThreshold(max(getBitsVec(pixelFormat) - (isTrilinear ? 2 : 1), tcu::IVec4(0)));
		lookupPrec.colorMask		= getCompareMask(pixelFormat);
		lodPrec.derivateBits		= 10;
		lodPrec.lodBits				= 8;

		for (int gridY = 0; gridY < gridHeight; gridY++)
		{
			for (int gridX = 0; gridX < gridWidth; gridX++)
			{
				const int	curX		= cellWidth*gridX;
				const int	curY		= cellHeight*gridY;
				const int	curW		= gridX+1 == gridWidth ? (viewportWidth-curX) : cellWidth;
				const int	curH		= gridY+1 == gridHeight ? (viewportHeight-curY) : cellHeight;
				const int	cellNdx		= gridY*gridWidth + gridX;

				getBasicTexCoord3D(texCoord, cellNdx);
				getReferenceParams(refParams, cellNdx);

				// Render ideal result
				sampleTexture(tcu::SurfaceAccess(referenceFrame, pixelFormat, curX, curY, curW, curH),
							  refTexture, &texCoord[0], refParams);

				// Compare this cell
				numFailedPixels += computeTextureLookupDiff(tcu::getSubregion(renderedFrame.getAccess(), curX, curY, curW, curH),
															tcu::getSubregion(referenceFrame.getAccess(), curX, curY, curW, curH),
															tcu::getSubregion(errorMask.getAccess(), curX, curY, curW, curH),
															m_texture->getTexture(), &texCoord[0], refParams,
															lookupPrec, lodPrec, m_context.getTestContext().getWatchDog());
			}
		}

		if (numFailedPixels > 0)
		{
			m_context.getTestContext().getLog() << TestLog::Message << "ERROR: Image verification failed, found " << numFailedPixels << " invalid pixels!" << TestLog::EndMessage;
		}

		m_context.getTestContext().getLog() << TestLog::ImageSet("Result", "Verification result")
											<< TestLog::Image("Rendered", "Rendered image", renderedFrame);

		if (numFailedPixels > 0)
		{
			m_context.getTestContext().getLog() << TestLog::Image("Reference", "Ideal reference", referenceFrame)
												<< TestLog::Image("ErrorMask", "Error mask", errorMask);
		}

		m_context.getTestContext().getLog() << TestLog::EndImageSet;

		{
			const bool isOk = numFailedPixels == 0;
			return isOk ? tcu::TestStatus::pass("pass") : tcu::TestStatus::fail("fail");
		}
	}
}